

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

base_learner * gd_mf_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  undefined8 uVar3;
  pointer pgVar4;
  unsigned_long uVar5;
  learner<gdmf,_example> *this;
  vw *in_RSI;
  _func_void_gdmf_ptr *in_RDI;
  float fVar6;
  float fVar7;
  learner<gdmf,_example> *l;
  float temp;
  stringstream __msg_3;
  stringstream __msg_2;
  stringstream __msg_1;
  stringstream __msg;
  option_group_definition gf_md_options;
  bool conjugate_gradient;
  bool bfgs;
  free_ptr<gdmf> data;
  undefined4 in_stack_fffffffffffff318;
  uint32_t in_stack_fffffffffffff31c;
  typed_option<bool> *in_stack_fffffffffffff320;
  string *in_stack_fffffffffffff328;
  uint32_t in_stack_fffffffffffff330;
  undefined2 in_stack_fffffffffffff334;
  byte in_stack_fffffffffffff336;
  byte in_stack_fffffffffffff337;
  string *in_stack_fffffffffffff338;
  undefined8 in_stack_fffffffffffff340;
  int plineNumber;
  allocator *paVar8;
  undefined6 in_stack_fffffffffffff348;
  undefined1 in_stack_fffffffffffff34e;
  undefined1 in_stack_fffffffffffff34f;
  vw_exception *in_stack_fffffffffffff350;
  _func_void_gdmf_ptr *p_Var9;
  byte local_c9a;
  typed_option<bool> *in_stack_fffffffffffff368;
  option_group_definition *in_stack_fffffffffffff370;
  allocator local_b69;
  string local_b68 [37];
  byte local_b43;
  byte local_b42;
  allocator local_b41;
  string local_b40 [39];
  allocator local_b19;
  string local_b18 [39];
  allocator local_af1;
  string local_af0 [32];
  float local_ad0;
  undefined1 local_ac9;
  stringstream local_aa8 [16];
  ostream local_a98;
  undefined1 local_919;
  stringstream local_8f8 [16];
  ostream local_8e8;
  allocator local_769;
  string local_768 [39];
  undefined1 local_741;
  stringstream local_720 [16];
  ostream local_710;
  allocator local_591;
  string local_590 [39];
  undefined1 local_569;
  stringstream local_548 [16];
  ostream local_538;
  allocator local_3b9;
  string local_3b8 [32];
  undefined4 local_398;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [199];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [199];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<unsigned_int> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [62];
  byte local_2a;
  byte local_29;
  vw *local_18;
  _func_void_gdmf_ptr *local_10;
  typed_option<bool> *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff340 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<gdmf>();
  local_29 = 0;
  local_2a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Gradient Descent Matrix Factorization",&local_89);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff320,
             (string *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"rank",&local_161);
  std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
            ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x27fd58);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff328,(uint *)in_stack_fffffffffffff320)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"rank for matrix factorization.",&local_189);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff320,
             (string *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff370,(typed_option<unsigned_int> *)in_stack_fffffffffffff368);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff320);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"bfgs",&local_251);
  VW::config::make_option<bool>(in_stack_fffffffffffff328,(bool *)in_stack_fffffffffffff320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"Option not supported by this reduction",&local_279);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff320,
             (string *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff320);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"conjugate_gradient",&local_341);
  VW::config::make_option<bool>(in_stack_fffffffffffff328,(bool *)in_stack_fffffffffffff320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"Option not supported by this reduction",&local_369);
  VW::config::typed_option<bool>::help
            (in_stack_fffffffffffff320,
             (string *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff320);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  (*(code *)**(undefined8 **)local_10)(local_10,local_68);
  p_Var9 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"rank",&local_391);
  bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_390);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  p_Var9 = local_10;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"adaptive",&local_3b9);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_3b8);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    p_Var9 = local_10;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_548);
      std::operator<<(&local_538,"adaptive is not implemented for matrix factorization");
      local_569 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff350,
                 (char *)CONCAT17(in_stack_fffffffffffff34f,
                                  CONCAT16(in_stack_fffffffffffff34e,in_stack_fffffffffffff348)),
                 plineNumber,in_stack_fffffffffffff338);
      local_569 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_590,"normalized",&local_591);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_590);
    std::__cxx11::string::~string(local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    p_Var9 = local_10;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_720);
      std::operator<<(&local_710,"normalized is not implemented for matrix factorization");
      local_741 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff350,
                 (char *)CONCAT17(in_stack_fffffffffffff34f,
                                  CONCAT16(in_stack_fffffffffffff34e,in_stack_fffffffffffff348)),
                 plineNumber,in_stack_fffffffffffff338);
      local_741 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_768,"exact_adaptive_norm",&local_769);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_768);
    std::__cxx11::string::~string(local_768);
    std::allocator<char>::~allocator((allocator<char> *)&local_769);
    pvVar1 = local_18;
    if ((bVar2 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_8f8);
      std::operator<<(&local_8e8,
                      "normalized adaptive updates is not implemented for matrix factorization");
      local_919 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff350,
                 (char *)CONCAT17(in_stack_fffffffffffff34f,
                                  CONCAT16(in_stack_fffffffffffff34e,in_stack_fffffffffffff348)),
                 plineNumber,in_stack_fffffffffffff338);
      local_919 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (((local_29 & 1) != 0) || ((local_2a & 1) != 0)) {
      std::__cxx11::stringstream::stringstream(local_aa8);
      std::operator<<(&local_a98,"bfgs is not implemented for matrix factorization");
      local_ac9 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff350,
                 (char *)CONCAT17(in_stack_fffffffffffff34f,
                                  CONCAT16(in_stack_fffffffffffff34e,in_stack_fffffffffffff348)),
                 plineNumber,in_stack_fffffffffffff338);
      local_ac9 = 0;
      __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x280ad2);
    pgVar4->all = pvVar1;
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x280aea);
    pgVar4->no_win_counter = 0;
    pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                       ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x280aff);
    fVar6 = logf((float)(pgVar4->rank * 2 + 1));
    fVar7 = logf(2.0);
    local_ad0 = ceilf(fVar6 / fVar7);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff320,in_stack_fffffffffffff31c);
    local_18->random_weights = true;
    if ((local_18->holdout_set_off & 1U) == 0) {
      local_18->sd->holdout_best_loss = 3.4028234663852886e+38;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_af0,"early_terminate",&local_af1);
      VW::config::options_i::get_typed_option<unsigned_long>
                ((options_i *)in_stack_fffffffffffff350,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff34f,
                          CONCAT16(in_stack_fffffffffffff34e,in_stack_fffffffffffff348)));
      uVar5 = VW::config::typed_option<unsigned_long>::value
                        ((typed_option<unsigned_long> *)in_stack_fffffffffffff320);
      pgVar4 = std::unique_ptr<gdmf,_void_(*)(void_*)>::operator->
                         ((unique_ptr<gdmf,_void_(*)(void_*)> *)0x280c3c);
      pgVar4->early_stop_thres = uVar5;
      std::__cxx11::string::~string(local_af0);
      std::allocator<char>::~allocator((allocator<char> *)&local_af1);
    }
    paVar8 = &local_b19;
    p_Var9 = local_10;
    std::allocator<char>::allocator();
    local_b42 = 0;
    local_b43 = 0;
    std::__cxx11::string::string(local_b18,"learning_rate",paVar8);
    bVar2 = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_b18);
    local_c9a = 0;
    if ((bVar2 & 1) == 0) {
      p_Var9 = local_10;
      std::allocator<char>::allocator();
      local_b42 = 1;
      std::__cxx11::string::string(local_b40,"l",&local_b41);
      local_b43 = 1;
      local_c9a = (**(code **)(*(long *)p_Var9 + 8))(p_Var9,local_b40);
      local_c9a = local_c9a ^ 0xff;
    }
    if ((local_b43 & 1) != 0) {
      std::__cxx11::string::~string(local_b40);
    }
    if ((local_b42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_b41);
    }
    std::__cxx11::string::~string(local_b18);
    std::allocator<char>::~allocator((allocator<char> *)&local_b19);
    if ((local_c9a & 1) != 0) {
      local_18->eta = 10.0;
    }
    paVar8 = &local_b69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b68,"initial_t",paVar8);
    in_stack_fffffffffffff337 = (**(code **)(*(long *)local_10 + 8))(local_10,local_b68);
    in_stack_fffffffffffff336 = in_stack_fffffffffffff337 ^ 0xff;
    std::__cxx11::string::~string(local_b68);
    std::allocator<char>::~allocator((allocator<char> *)&local_b69);
    if ((in_stack_fffffffffffff336 & 1) != 0) {
      local_18->sd->t = 1.0;
      local_18->initial_t = 1.0;
    }
    fVar6 = powf((float)local_18->sd->t,local_18->power_t);
    local_18->eta = local_18->eta * fVar6;
    in_stack_fffffffffffff330 =
         parameters::stride_shift
                   ((parameters *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    this = LEARNER::init_learner<gdmf,example,LEARNER::learner<char,example>>
                     ((free_ptr<gdmf> *)
                      CONCAT17(in_stack_fffffffffffff337,
                               CONCAT16(in_stack_fffffffffffff336,
                                        CONCAT24(in_stack_fffffffffffff334,in_stack_fffffffffffff330
                                                ))),
                      (_func_void_gdmf_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff328,
                      (_func_void_gdmf_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff320,
                      CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    LEARNER::learner<gdmf,_example>::set_save_load(this,save_load);
    LEARNER::learner<gdmf,_example>::set_end_pass((learner<gdmf,_example> *)paVar8,local_10);
    LEARNER::learner<gdmf,_example>::set_finish((learner<gdmf,_example> *)paVar8,local_10);
    in_stack_fffffffffffff320 = (typed_option<bool> *)LEARNER::make_base<gdmf,example>(this);
    local_8 = in_stack_fffffffffffff320;
  }
  else {
    local_8 = (typed_option<bool> *)0x0;
  }
  local_398 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff320);
  std::unique_ptr<gdmf,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<gdmf,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff337,
                      CONCAT16(in_stack_fffffffffffff336,
                               CONCAT24(in_stack_fffffffffffff334,in_stack_fffffffffffff330))));
  return (base_learner *)local_8;
}

Assistant:

base_learner* gd_mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<gdmf>();

  bool bfgs = false;
  bool conjugate_gradient = false;
  option_group_definition gf_md_options("Gradient Descent Matrix Factorization");
  gf_md_options.add(make_option("rank", data->rank).keep().help("rank for matrix factorization."));

  // Not supported, need to be checked to be false.
  gf_md_options.add(make_option("bfgs", bfgs).help("Option not supported by this reduction"));
  gf_md_options.add(
      make_option("conjugate_gradient", conjugate_gradient).help("Option not supported by this reduction"));
  options.add_and_parse(gf_md_options);

  if (!options.was_supplied("rank"))
    return nullptr;

  if (options.was_supplied("adaptive"))
    THROW("adaptive is not implemented for matrix factorization");
  if (options.was_supplied("normalized"))
    THROW("normalized is not implemented for matrix factorization");
  if (options.was_supplied("exact_adaptive_norm"))
    THROW("normalized adaptive updates is not implemented for matrix factorization");

  if (bfgs || conjugate_gradient)
    THROW("bfgs is not implemented for matrix factorization");

  data->all = &all;
  data->no_win_counter = 0;

  // store linear + 2*rank weights per index, round up to power of two
  float temp = ceilf(logf((float)(data->rank * 2 + 1)) / logf(2.f));
  all.weights.stride_shift((size_t)temp);
  all.random_weights = true;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    data->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (!options.was_supplied("learning_rate") && !options.was_supplied("l"))
    all.eta = 10;  // default learning rate to 10 for non default update rule

  // default initial_t to 1 instead of 0
  if (!options.was_supplied("initial_t"))
  {
    all.sd->t = 1.f;
    all.initial_t = 1.f;
  }
  all.eta *= powf((float)(all.sd->t), all.power_t);

  learner<gdmf, example>& l = init_learner(data, learn, predict, (UINT64_ONE << all.weights.stride_shift()));
  l.set_save_load(save_load);
  l.set_end_pass(end_pass);
  l.set_finish(finish);

  return make_base(l);
}